

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

void __thiscall Variable_hasInterfaceType_Test::TestBody(Variable_hasInterfaceType_Test *this)

{
  char cVar1;
  byte bVar2;
  AssertionResult gtest_ar_;
  VariablePtr v1;
  long *local_58;
  AssertHelper local_50 [8];
  byte local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  long *local_38 [2];
  long local_28 [2];
  InterfaceType local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  libcellml::Variable::create();
  libcellml::Variable::setInterfaceType(local_18);
  local_48[0] = libcellml::Variable::hasInterfaceType(local_18);
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48[0] == 0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_38,(char *)local_48,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::PRIVATE)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1b5,(char *)local_38[0]);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    if (local_58 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
      local_58 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Variable::setInterfaceType(local_18);
  bVar2 = libcellml::Variable::hasInterfaceType(local_18);
  local_48[0] = bVar2 ^ 1;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 != 0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_38,(char *)local_48,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::PRIVATE)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1b8,(char *)local_38[0]);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    if (local_58 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
      local_58 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48[0] = libcellml::Variable::hasInterfaceType(local_18);
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48[0] == 0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_38,(char *)local_48,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1b9,(char *)local_38[0]);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    if (local_58 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
      local_58 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Variable::setInterfaceType(local_18);
  bVar2 = libcellml::Variable::hasInterfaceType(local_18);
  local_48[0] = bVar2 ^ 1;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 != 0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_38,(char *)local_48,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1bc,(char *)local_38[0]);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    if (local_58 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
      local_58 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48[0] = libcellml::Variable::hasInterfaceType(local_18);
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48[0] == 0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_38,(char *)local_48,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::NONE)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1bd,(char *)local_38[0]);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    if (local_58 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
      local_58 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Variable::setInterfaceType(local_18);
  bVar2 = libcellml::Variable::hasInterfaceType(local_18);
  local_48[0] = bVar2 ^ 1;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 != 0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_38,(char *)local_48,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::NONE)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1c0,(char *)local_38[0]);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    if (local_58 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
      local_58 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48[0] = libcellml::Variable::hasInterfaceType(local_18);
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48[0] == 0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_38,(char *)local_48,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE)",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1c1,(char *)local_38[0]);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    if (local_58 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
      local_58 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Variable::removeInterfaceType();
  bVar2 = libcellml::Variable::hasInterfaceType(local_18);
  local_48[0] = bVar2 ^ 1;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 != 0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_38,(char *)local_48,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE)","true"
              );
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1c4,(char *)local_38[0]);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    if (local_58 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
      local_58 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48[0] = libcellml::Variable::hasInterfaceType(local_18);
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48[0] == 0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_38,(char *)local_48,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::NONE)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1c5,(char *)local_38[0]);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    if (local_58 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
      local_58 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return;
}

Assistant:

TEST(Variable, hasInterfaceType)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();

    v1->setInterfaceType(libcellml::Variable::InterfaceType::PRIVATE);
    EXPECT_TRUE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PRIVATE));

    v1->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC);
    EXPECT_FALSE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PRIVATE));
    EXPECT_TRUE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC));

    v1->setInterfaceType(libcellml::Variable::InterfaceType::NONE);
    EXPECT_FALSE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC));
    EXPECT_TRUE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::NONE));

    v1->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE);
    EXPECT_FALSE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::NONE));
    EXPECT_TRUE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE));

    v1->removeInterfaceType();
    EXPECT_FALSE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE));
    EXPECT_TRUE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::NONE));
}